

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O2

void enterBlock(vm *v,byte op_code,func_type bt,vec *instructions)

{
  control_frame *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  byte bVar4;
  control_frame in_stack_ffffffffffffff68;
  control_frame cf;
  
  bVar4 = 0;
  cf.opcode = op_code;
  cf.instructions = instructions;
  cf.block_type.param_count = (uint32)bt._0_8_;
  cf.block_type._4_4_ = SUB84(bt._0_8_,4);
  cf.block_type.param_types = bt.param_types;
  cf.block_type.return_count = bt.return_count;
  cf.block_type._20_4_ = bt._20_4_;
  cf.block_type.return_types = bt.return_types;
  cf.bp = (v->operandStack).size - (ulong)bt.param_count;
  cf.pc = 0;
  cf.depth = 0;
  if ((byte)(op_code - 2) < 3) {
    pcVar1 = get_top_control_stack_ele_p(&v->controlStack);
    cf.depth = pcVar1->depth + 1;
  }
  pcVar1 = &cf;
  puVar3 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar3 = *(undefined8 *)pcVar1;
    pcVar1 = (control_frame *)((long)pcVar1 + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  push_control_stack(&v->controlStack,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void enterBlock(vm *v, byte op_code, func_type bt, vec *instructions) {
    control_frame cf = {
            .opcode = op_code,
            .instructions = instructions,
            .block_type = bt,
            .bp = v->operandStack.size - bt.param_count,
            .pc = 0,
            .depth=0
    };
    if (cf.opcode == Block || cf.opcode == Loop || cf.opcode == If) {
        cf.depth = get_top_control_stack_ele_p(&v->controlStack)->depth + 1;
    }
    push_control_stack(&v->controlStack, cf);
}